

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzer.cpp
# Opt level: O0

void __thiscall SWDAnalyzer::WorkerThread(SWDAnalyzer *this)

{
  bool bVar1;
  AnalyzerChannelData *pAVar2;
  element_type *peVar3;
  SWDBit local_b8;
  undefined1 local_80 [8];
  SWDBit error_bit;
  SWDLineReset reset;
  SWDOperation tran;
  SWDAnalyzer *this_local;
  
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSWDIO = pAVar2;
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSWCLK = pAVar2;
  SWDParser::Setup(&this->mSWDParser,this->mSWDIO,this->mSWCLK,this);
  SWDOperation::SWDOperation
            ((SWDOperation *)
             &reset.bits.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  SWDLineReset::SWDLineReset((SWDLineReset *)&error_bit.low_end);
  SWDParser::Clear(&this->mSWDParser);
  do {
    bVar1 = SWDParser::IsOperation
                      (&this->mSWDParser,
                       (SWDOperation *)
                       &reset.bits.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      peVar3 = std::auto_ptr<SWDAnalyzerResults>::get(&this->mResults);
      SWDOperation::AddFrames
                ((SWDOperation *)
                 &reset.bits.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,peVar3);
      peVar3 = std::auto_ptr<SWDAnalyzerResults>::get(&this->mResults);
      SWDOperation::AddMarkers
                ((SWDOperation *)
                 &reset.bits.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,peVar3);
      std::auto_ptr<SWDAnalyzerResults>::operator->(&this->mResults);
      AnalyzerResults::CommitResults();
    }
    else {
      bVar1 = SWDParser::IsLineReset(&this->mSWDParser,(SWDLineReset *)&error_bit.low_end);
      if (bVar1) {
        peVar3 = std::auto_ptr<SWDAnalyzerResults>::get(&this->mResults);
        SWDLineReset::AddFrames((SWDLineReset *)&error_bit.low_end,&peVar3->super_AnalyzerResults);
        std::auto_ptr<SWDAnalyzerResults>::operator->(&this->mResults);
        AnalyzerResults::CommitResults();
      }
      else {
        SWDParser::PopFrontBit(&local_b8,&this->mSWDParser);
        memcpy(local_80,&local_b8,0x28);
      }
    }
    AnalyzerChannelData::GetSampleNumber();
    Analyzer::ReportProgress((ulonglong)this);
  } while( true );
}

Assistant:

void SWDAnalyzer::WorkerThread()
{
    // SetupResults();
    // get the channel pointers
    mSWDIO = GetAnalyzerChannelData( mSettings.mSWDIO );
    mSWCLK = GetAnalyzerChannelData( mSettings.mSWCLK );

    mSWDParser.Setup( mSWDIO, mSWCLK, this );

    // these are our three objects that SWDParser will fill with data
    // on calls to IsOperation or IsLineReset
    SWDOperation tran;
    SWDLineReset reset;
    SWDBit error_bit;

    mSWDParser.Clear();

    // For every new bit the parser extracts from the stream,
    // ask if this can be a valid operation or line reset.
    // A valid operation will have the constant part of the request correctly set,
    // and also the parity bits will be correct.
    // A valid line reset has at least 50 high bits in succession.
    for( ;; )
    {
        if( mSWDParser.IsOperation( tran ) )
        {
            tran.AddFrames( mResults.get() );
            tran.AddMarkers( mResults.get() );

            mResults->CommitResults();
        }
        else if( mSWDParser.IsLineReset( reset ) )
        {
            reset.AddFrames( mResults.get() );

            mResults->CommitResults();
        }
        else
        {
            // This is neither a valid transaction nor a valid reset,
            // so remove the first bit and try again.
            // We're dropping the error bit into oblivion.
            error_bit = mSWDParser.PopFrontBit();
        }

        ReportProgress( mSWDIO->GetSampleNumber() );
    }
}